

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

void __thiscall QToolBarLayout::updateMarginAndSpacing(QToolBarLayout *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  QWidget *pQVar5;
  QStyle *pQVar6;
  long in_FS_OFFSET;
  QStyleOptionToolBar opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = QLayout::parentWidget(&this->super_QLayout);
  pQVar5 = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&pQVar5->super_QObject)->super_QWidget
  ;
  if (pQVar5 != (QWidget *)0x0) {
    pQVar6 = QWidget::style(pQVar5);
    opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionToolBar::QStyleOptionToolBar(&opt);
    (**(code **)(*(long *)pQVar5 + 0x1a0))(pQVar5,&opt);
    iVar2 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x37,&opt,pQVar5);
    iVar3 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x34,&opt,pQVar5);
    iVar2 = iVar2 + iVar3;
    QLayout::setContentsMargins(&this->super_QLayout,iVar2,iVar2,iVar2,iVar2);
    uVar4 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x36,&opt,pQVar5);
    (**(code **)(*(long *)&this->super_QLayout + 0x68))(this,uVar4);
    QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::updateMarginAndSpacing()
{
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int margin = style->pixelMetric(QStyle::PM_ToolBarItemMargin, &opt, tb)
            + style->pixelMetric(QStyle::PM_ToolBarFrameWidth, &opt, tb);
    setContentsMargins(margin, margin, margin, margin);
    setSpacing(style->pixelMetric(QStyle::PM_ToolBarItemSpacing, &opt, tb));
}